

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::setVideoMode(WindowImplX11 *this,VideoMode *mode)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  VideoMode *in_RSI;
  long in_RDI;
  VideoMode VVar6;
  int i;
  RRMode xRandMode;
  bool modeFound;
  XRRCrtcInfo *crtcInfo;
  XRROutputInfo *outputInfo;
  RROutput output;
  XRRScreenResources *res;
  Window rootWindow;
  int xRandRMinor;
  int xRandRMajor;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  XRRScreenResources *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  WindowImplX11 *in_stack_ffffffffffffff68;
  int local_74;
  undefined8 local_70;
  RROutput local_50;
  long local_48;
  undefined8 local_40;
  VideoMode local_30;
  VideoMode local_1c;
  VideoMode *local_10;
  
  local_10 = in_RSI;
  VVar6 = VideoMode::getDesktopMode();
  local_30._0_8_ = VVar6._0_8_;
  local_1c.width = local_30.width;
  local_1c.height = local_30.height;
  local_30.bitsPerPixel = VVar6.bitsPerPixel;
  local_1c.bitsPerPixel = local_30.bitsPerPixel;
  local_30 = VVar6;
  bVar2 = sf::operator==(in_RSI,&local_1c);
  if (!bVar2) {
    bVar2 = checkXRandR(in_stack_ffffffffffffff68,
                        (int *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        (int *)in_stack_ffffffffffffff58);
    if (bVar2) {
      local_40 = *(undefined8 *)
                  (*(long *)(*(long *)(in_RDI + 0x3d0) + 0xe8) +
                   (long)*(int *)(in_RDI + 0x3d8) * 0x80 + 0x10);
      local_48 = XRRGetScreenResources(*(undefined8 *)(in_RDI + 0x3d0),local_40);
      if (local_48 == 0) {
        poVar3 = err();
        poVar3 = std::operator<<(poVar3,
                                 "Failed to get the current screen resources for fullscreen mode, switching to window mode"
                                );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        local_50 = getOutputPrimary(in_stack_ffffffffffffff68,
                                    (Window *)
                                    CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                    in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                    in_stack_ffffffffffffff50);
        lVar4 = XRRGetOutputInfo(*(undefined8 *)(in_RDI + 0x3d0),local_48,local_50);
        if ((lVar4 == 0) || (*(short *)(lVar4 + 0x30) == 1)) {
          XRRFreeScreenResources(local_48);
          if (lVar4 != 0) {
            XRRFreeOutputInfo(lVar4);
          }
          poVar3 = err();
          poVar3 = std::operator<<(poVar3,
                                   "Failed to get output info for fullscreen mode, switching to window mode"
                                  );
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        else {
          lVar5 = XRRGetCrtcInfo(*(undefined8 *)(in_RDI + 0x3d0),local_48,*(undefined8 *)(lVar4 + 8)
                                );
          if (lVar5 == 0) {
            XRRFreeScreenResources(local_48);
            XRRFreeOutputInfo(lVar4);
            poVar3 = err();
            poVar3 = std::operator<<(poVar3,
                                     "Failed to get crtc info for fullscreen mode, switching to window mode"
                                    );
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          }
          else {
            bVar2 = false;
            local_74 = 0;
            while( true ) {
              bVar1 = false;
              if (local_74 < *(int *)(local_48 + 0x30)) {
                bVar1 = (bool)(bVar2 ^ 1);
              }
              if (!bVar1) break;
              if ((*(short *)(lVar5 + 0x20) == 2) || (*(short *)(lVar5 + 0x20) == 8)) {
                std::swap<unsigned_int>
                          ((uint *)(*(long *)(local_48 + 0x38) + (long)local_74 * 0x50 + 0xc),
                           (uint *)(*(long *)(local_48 + 0x38) + (long)local_74 * 0x50 + 8));
              }
              if ((*(uint *)(*(long *)(local_48 + 0x38) + (long)local_74 * 0x50 + 8) ==
                   local_10->width) &&
                 (*(uint *)(*(long *)(local_48 + 0x38) + (long)local_74 * 0x50 + 0xc) ==
                  local_10->height)) {
                local_70 = *(undefined8 *)(*(long *)(local_48 + 0x38) + (long)local_74 * 0x50);
                bVar2 = true;
              }
              local_74 = local_74 + 1;
            }
            if (bVar2) {
              *(undefined8 *)(in_RDI + 0x3f8) = *(undefined8 *)(lVar5 + 0x18);
              *(undefined8 *)(in_RDI + 0x400) = *(undefined8 *)(lVar4 + 8);
              XRRSetCrtcConfig(*(undefined8 *)(in_RDI + 0x3d0),local_48,*(undefined8 *)(lVar4 + 8),0
                               ,*(undefined4 *)(lVar5 + 8),*(undefined4 *)(lVar5 + 0xc),local_70,
                               *(undefined2 *)(lVar5 + 0x20),&local_50,1);
              (anonymous_namespace)::WindowsImplX11Impl::fullscreenWindow = in_RDI;
              XRRFreeScreenResources(local_48);
              XRRFreeOutputInfo(lVar4);
              XRRFreeCrtcInfo(lVar5);
            }
            else {
              XRRFreeScreenResources(local_48);
              XRRFreeOutputInfo(lVar4);
              poVar3 = err();
              poVar3 = std::operator<<(poVar3,
                                       "Failed to find a matching RRMode for fullscreen mode, switching to window mode"
                                      );
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            }
          }
        }
      }
    }
    else {
      poVar3 = err();
      poVar3 = std::operator<<(poVar3,"Fullscreen is not supported, switching to window mode");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void WindowImplX11::setVideoMode(const VideoMode& mode)
{
    using namespace WindowsImplX11Impl;

    // Skip mode switching if the new mode is equal to the desktop mode
    if (mode == VideoMode::getDesktopMode())
        return;

    // Check if the XRandR extension is present
    int xRandRMajor, xRandRMinor;
    if (!checkXRandR(xRandRMajor, xRandRMinor))
    {
        // XRandR extension is not supported: we cannot use fullscreen mode
        err() << "Fullscreen is not supported, switching to window mode" << std::endl;
        return;
    }

    // Get root window
    ::Window rootWindow = RootWindow(m_display, m_screen);

    // Get the screen resources
    XRRScreenResources* res = XRRGetScreenResources(m_display, rootWindow);
    if (!res)
    {
        err() << "Failed to get the current screen resources for fullscreen mode, switching to window mode" << std::endl;
        return;
    }

    RROutput output = getOutputPrimary(rootWindow, res, xRandRMajor, xRandRMinor);

    // Get output info from output
    XRROutputInfo* outputInfo = XRRGetOutputInfo(m_display, res, output);
    if (!outputInfo || outputInfo->connection == RR_Disconnected)
    {
        XRRFreeScreenResources(res);

        // If outputInfo->connection == RR_Disconnected, free output info
        if (outputInfo)
            XRRFreeOutputInfo(outputInfo);

        err() << "Failed to get output info for fullscreen mode, switching to window mode" << std::endl;
        return;
    }

    // Retreive current RRMode, screen position and rotation
    XRRCrtcInfo* crtcInfo = XRRGetCrtcInfo(m_display, res, outputInfo->crtc);
    if (!crtcInfo)
    {
        XRRFreeScreenResources(res);
        XRRFreeOutputInfo(outputInfo);
        err() << "Failed to get crtc info for fullscreen mode, switching to window mode" << std::endl;
        return;
    }

    // Find RRMode to set
    bool modeFound = false;
    RRMode xRandMode;

    for (int i = 0; (i < res->nmode) && !modeFound; i++)
    {
        if (crtcInfo->rotation == RR_Rotate_90 || crtcInfo->rotation == RR_Rotate_270)
            std::swap(res->modes[i].height, res->modes[i].width);

        // Check if screen size match
        if ((res->modes[i].width == mode.width) &&
            (res->modes[i].height == mode.height))
        {
            xRandMode = res->modes[i].id;
            modeFound = true;
        }
    }

    if (!modeFound)
    {
        XRRFreeScreenResources(res);
        XRRFreeOutputInfo(outputInfo);
        err() << "Failed to find a matching RRMode for fullscreen mode, switching to window mode" << std::endl;
        return;
    }

    // Save the current video mode before we switch to fullscreen
    m_oldVideoMode = crtcInfo->mode;
    m_oldRRCrtc = outputInfo->crtc;

    // Switch to fullscreen mode
    XRRSetCrtcConfig(m_display,
                     res,
                     outputInfo->crtc,
                     CurrentTime,
                     crtcInfo->x,
                     crtcInfo->y,
                     xRandMode,
                     crtcInfo->rotation,
                     &output,
                     1);

    // Set "this" as the current fullscreen window
    fullscreenWindow = this;

    XRRFreeScreenResources(res);
    XRRFreeOutputInfo(outputInfo);
    XRRFreeCrtcInfo(crtcInfo);
}